

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O1

void __thiscall
duckdb::LocalSortState::SinkChunk(LocalSortState *this,DataChunk *sort,DataChunk *payload)

{
  value_type vVar1;
  value_type vVar2;
  data_ptr_t *key_locations;
  idx_t iVar3;
  idx_t prefix_len;
  SortLayout *pSVar4;
  RowLayout *layout;
  unsafe_unique_array<UnifiedVectorFormat> uVar5;
  const_reference cVar6;
  pointer pRVar7;
  SelectionVector *pSVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  type pRVar13;
  size_type sVar14;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_d8;
  unsafe_unique_array<UnifiedVectorFormat> blob_data;
  pointer pVStack_b0;
  pointer local_a8;
  unsafe_unique_array<UnifiedVectorFormat> input_data;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_48;
  
  key_locations = (data_ptr_t *)(this->addresses).data;
  pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->radix_sorting_data);
  iVar3 = sort->count;
  pSVar8 = FlatVector::IncrementalSelectionVector();
  RowDataCollection::Build
            ((vector<duckdb::BufferHandle,_true> *)&local_d8,pRVar7,iVar3,key_locations,(idx_t *)0x0
             ,pSVar8);
  if ((sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar14 = 0;
    do {
      cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->has_null,sVar14);
      pvVar9 = vector<duckdb::OrderByNullType,_true>::operator[]
                         (&this->sort_layout->order_by_null_types,sVar14);
      vVar1 = *pvVar9;
      pvVar10 = vector<duckdb::OrderType,_true>::operator[](&this->sort_layout->order_types,sVar14);
      vVar2 = *pvVar10;
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&sort->data,sVar14);
      iVar3 = sort->count;
      pSVar8 = this->sel_ptr;
      pvVar12 = vector<unsigned_long,_true>::operator[](&this->sort_layout->prefix_lengths,sVar14);
      prefix_len = *pvVar12;
      pvVar12 = vector<unsigned_long,_true>::operator[](&this->sort_layout->column_sizes,sVar14);
      RowOperations::RadixScatter
                (pvVar11,iVar3,pSVar8,iVar3,key_locations,vVar2 == DESCENDING,cVar6,
                 vVar1 == NULLS_FIRST,prefix_len,*pvVar12,0);
      sVar14 = sVar14 + 1;
    } while (sVar14 < (ulong)(((long)(sort->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(sort->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  if (this->sort_layout->all_constant == false) {
    DataChunk::DataChunk((DataChunk *)&input_data);
    iVar3 = sort->count;
    if ((sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar14 = 0;
      do {
        cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,sVar14);
        if (!cVar6) {
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&sort->data,sVar14);
          ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
          emplace_back<duckdb::Vector&>
                    ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&input_data,pvVar11);
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 < (ulong)(((long)(sort->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(sort->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(&this->blob_sorting_data);
    pSVar8 = FlatVector::IncrementalSelectionVector();
    RowDataCollection::Build
              ((vector<duckdb::BufferHandle,_true> *)&local_48,pRVar7,iVar3,key_locations,
               (idx_t *)0x0,pSVar8);
    local_a8 = (pointer)local_d8.
                        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pVStack_b0 = (pointer)local_d8.
                          super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
    blob_data.
    super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
    .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl =
         (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
          )(unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
            )local_d8.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&blob_data);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
    DataChunk::ToUnifiedFormat((DataChunk *)&blob_data);
    uVar5 = blob_data;
    pSVar4 = this->sort_layout;
    pRVar13 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator*(&this->blob_sorting_heap);
    RowOperations::Scatter
              ((DataChunk *)&input_data,
               (UnifiedVectorFormat *)
               uVar5.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl,
               &pSVar4->blob_layout,&this->addresses,pRVar13,this->sel_ptr,iVar3);
    if (blob_data.
        super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>,_true,_true>
         )0x0) {
      ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                ((default_delete<duckdb::UnifiedVectorFormat[]> *)&blob_data,
                 (UnifiedVectorFormat *)
                 blob_data.
                 super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                 .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl);
    }
    DataChunk::~DataChunk((DataChunk *)&input_data);
  }
  pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->payload_data);
  iVar3 = payload->count;
  pSVar8 = FlatVector::IncrementalSelectionVector();
  RowDataCollection::Build
            ((vector<duckdb::BufferHandle,_true> *)&blob_data,pRVar7,iVar3,key_locations,
             (idx_t *)0x0,pSVar8);
  input_data.
  super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl =
       (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        )(unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
          )local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)blob_data.
                super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl;
  local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVStack_b0;
  local_d8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  blob_data.
  super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl =
       (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        )(__uniq_ptr_data<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>,_true,_true>
          )0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&input_data);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&blob_data);
  DataChunk::ToUnifiedFormat((DataChunk *)&input_data);
  uVar5 = input_data;
  layout = this->payload_layout;
  pRVar13 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
            ::operator*(&this->payload_heap);
  RowOperations::Scatter
            (payload,(UnifiedVectorFormat *)
                     uVar5.
                     super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl,
             layout,&this->addresses,pRVar13,this->sel_ptr,payload->count);
  if (input_data.
      super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>,_true,_true>
       )0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&input_data,
               (UnifiedVectorFormat *)
               input_data.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl);
  }
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_d8);
  return;
}

Assistant:

void LocalSortState::SinkChunk(DataChunk &sort, DataChunk &payload) {
	D_ASSERT(sort.size() == payload.size());
	// Build and serialize sorting data to radix sortable rows
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto handles = radix_sorting_data->Build(sort.size(), data_pointers, nullptr);
	for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
		bool has_null = sort_layout->has_null[sort_col];
		bool nulls_first = sort_layout->order_by_null_types[sort_col] == OrderByNullType::NULLS_FIRST;
		bool desc = sort_layout->order_types[sort_col] == OrderType::DESCENDING;
		RowOperations::RadixScatter(sort.data[sort_col], sort.size(), sel_ptr, sort.size(), data_pointers, desc,
		                            has_null, nulls_first, sort_layout->prefix_lengths[sort_col],
		                            sort_layout->column_sizes[sort_col]);
	}

	// Also fully serialize blob sorting columns (to be able to break ties
	if (!sort_layout->all_constant) {
		DataChunk blob_chunk;
		blob_chunk.SetCardinality(sort.size());
		for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
			if (!sort_layout->constant_size[sort_col]) {
				blob_chunk.data.emplace_back(sort.data[sort_col]);
			}
		}
		handles = blob_sorting_data->Build(blob_chunk.size(), data_pointers, nullptr);
		auto blob_data = blob_chunk.ToUnifiedFormat();
		RowOperations::Scatter(blob_chunk, blob_data.get(), sort_layout->blob_layout, addresses, *blob_sorting_heap,
		                       sel_ptr, blob_chunk.size());
		D_ASSERT(blob_sorting_heap->keep_pinned);
	}

	// Finally, serialize payload data
	handles = payload_data->Build(payload.size(), data_pointers, nullptr);
	auto input_data = payload.ToUnifiedFormat();
	RowOperations::Scatter(payload, input_data.get(), *payload_layout, addresses, *payload_heap, sel_ptr,
	                       payload.size());
	D_ASSERT(payload_heap->keep_pinned);
}